

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawdata_create.c
# Opt level: O0

int rd_conv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_named_traits *pmVar1;
  mpt_type_t local_40;
  mpt_type_t me;
  mpt_named_traits *traits;
  mpt_RawData *rd;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  pmVar1 = mpt_rawdata_type_traits();
  if (pmVar1 == (mpt_named_traits *)0x0) {
    local_40 = 0x100;
  }
  else {
    local_40 = pmVar1->type;
    if (type == local_40) {
      if (ptr != (void *)0x0) {
        *(mpt_convertable **)ptr = val + 1;
      }
      return (int)local_40;
    }
  }
  val_local._4_4_ = (int)local_40;
  if (type == 0) {
    if (ptr != (void *)0x0) {
      *(char **)ptr = "\v";
    }
  }
  else if (type == 0x100) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val;
    }
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int rd_conv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(RawData) *rd = MPT_baseaddr(RawData, val, _mt);
	const MPT_STRUCT(named_traits) *traits = mpt_rawdata_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((const void **) ptr) = &rd->_rd;
		return me;
	}
	if (!type) {
		static const char fmt[] = { MPT_ENUM(TypeBufferPtr), 0 };
		if (ptr) *((const char **) ptr) = fmt;
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((const void **) ptr) = &rd->_mt;
		return me;
	}
	/* TODO: type info for stage data array
	if (type == MPT_ENUM(TypeArray)) {
		if (ptr) *((const void **) ptr) = &rd->st;
		return me;
	}*/
	return MPT_ERROR(BadType);
}